

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqbaselib.cpp
# Opt level: O3

SQInteger array_map(HSQUIRRELVM v)

{
  SQUnsignedInteger *pSVar1;
  SQSharedState *ss;
  SQObjectPtr *pSVar2;
  SQObjectValue this;
  SQInteger SVar3;
  SQObjectPtr ret;
  SQObjectPtr local_38;
  
  pSVar2 = SQVM::GetAt(v,v->_stackbase);
  SVar3 = ((pSVar2->super_SQObject)._unVal.pOuter)->_idx;
  ss = v->_sharedstate;
  this.pUserPointer = sq_vm_malloc(0x48);
  SQArray::SQArray(this.pArray,ss,SVar3);
  local_38.super_SQObject._type = OT_ARRAY;
  pSVar1 = &((this.pTable)->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
  *pSVar1 = *pSVar1 + 1;
  local_38.super_SQObject._unVal.pUserPointer = this.pUserPointer;
  SVar3 = __map_array(this.pArray,(pSVar2->super_SQObject)._unVal.pArray,v);
  if (SVar3 < 0) {
    SVar3 = -1;
  }
  else {
    SVar3 = 1;
    SQVM::Push(v,&local_38);
  }
  SQObjectPtr::~SQObjectPtr(&local_38);
  return SVar3;
}

Assistant:

static SQInteger array_map(HSQUIRRELVM v)
{
    SQObject &o = stack_get(v,1);
    SQInteger size = _array(o)->Size();
    SQObjectPtr ret = SQArray::Create(_ss(v),size);
    if(SQ_FAILED(__map_array(_array(ret),_array(o),v)))
        return SQ_ERROR;
    v->Push(ret);
    return 1;
}